

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O2

void __thiscall CombinePattern::restoreXml(CombinePattern *this,Element *el)

{
  pointer ppEVar1;
  ContextPattern *this_00;
  InstructionPattern *this_01;
  
  ppEVar1 = (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = (ContextPattern *)operator_new(0x10);
  (this_00->super_DisjointPattern).super_Pattern._vptr_Pattern =
       (_func_int **)&PTR__ContextPattern_004013a8;
  this_00->maskvalue = (PatternBlock *)0x0;
  this->context = this_00;
  ContextPattern::restoreXml(this_00,*ppEVar1);
  this_01 = (InstructionPattern *)operator_new(0x10);
  (this_01->super_DisjointPattern).super_Pattern._vptr_Pattern =
       (_func_int **)&PTR__InstructionPattern_00401318;
  this_01->maskvalue = (PatternBlock *)0x0;
  this->instr = this_01;
  InstructionPattern::restoreXml(this_01,ppEVar1[1]);
  return;
}

Assistant:

void CombinePattern::restoreXml(const Element *el)

{
  const List &list(el->getChildren());
  List::const_iterator iter;
  iter = list.begin();
  context = new ContextPattern();
  context->restoreXml(*iter);
  ++iter;
  instr = new InstructionPattern();
  instr->restoreXml(*iter);
}